

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O2

TValue * lj_tab_newkey(lua_State *L,GCtab *t,cTValue *key)

{
  TValue *pTVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  TValue *pTVar4;
  ulong uVar5;
  GCobj *o;
  uint uVar6;
  TValue *pTVar7;
  
  pTVar1 = &hashkey(t,key)->val;
  if (((pTVar1->field_2).it != 0xffffffff) || (t->hmask == 0)) {
    pTVar2 = (TValue *)(ulong)(t->node).ptr32;
    pTVar7 = (TValue *)(ulong)((MRef *)((long)pTVar2 + 0x14))->ptr32;
    pTVar3 = pTVar7;
    do {
      pTVar4 = pTVar3;
      if (pTVar4 == pTVar2) {
        rehashtab(L,t,key);
        pTVar1 = lj_tab_set(L,t,key);
        return pTVar1;
      }
      pTVar3 = pTVar4 + -3;
      uVar6 = (int)pTVar7 - 0x18;
      pTVar7 = (TValue *)(ulong)uVar6;
    } while (*(int *)((long)pTVar4 + -0xc) != -1);
    ((MRef *)((long)pTVar2 + 0x14))->ptr32 = uVar6;
    pTVar2 = &hashkey(t,pTVar1 + 1)->val;
    if (pTVar2 == pTVar1) {
      pTVar4[-1].field_2.field_0 = pTVar1[2].field_2.field_0;
      pTVar1[2].u32.lo = uVar6;
      pTVar1 = pTVar3;
    }
    else {
      do {
        pTVar7 = pTVar2;
        pTVar2 = (TValue *)(ulong)pTVar7[2].u32.lo;
      } while (pTVar1 != pTVar2);
      pTVar7[2].u32.lo = uVar6;
      pTVar3->field_2 = *(anon_struct_8_2_fd66bcdd_for_TValue_2 *)pTVar1;
      pTVar4[-2] = pTVar1[1];
      pTVar4[-1].field_2.field_0 = pTVar1[2].field_2.field_0;
      pTVar1[2].u32.lo = 0;
      (pTVar1->field_2).it = 0xffffffff;
      while( true ) {
        pTVar2 = pTVar3;
        uVar6 = pTVar2[2].u32.lo;
        pTVar3 = (TValue *)(ulong)uVar6;
        if (pTVar3 == (TValue *)0x0) break;
        if (((*(int *)((long)pTVar3 + 0xc) == -5) && ((pTVar3->field_2).it != 0xffffffff)) &&
           ((TValue *)
            ((ulong)(t->hmask & *(uint *)((ulong)pTVar3[1].u32.lo + 8)) * 0x18 +
            (ulong)(t->node).ptr32) == pTVar1)) {
          pTVar2[2].field_2.field_0 = pTVar3[2].field_2.field_0;
          pTVar3[2].field_2.field_0 = pTVar1[2].field_2.field_0;
          pTVar1[2].u32.lo = uVar6;
          pTVar3 = pTVar2;
        }
      }
    }
  }
  pTVar1[1] = *key;
  if ((t->marked & 4) != 0) {
    uVar5 = (ulong)(L->glref).ptr32;
    t->marked = t->marked & 0xfb;
    (t->gclist).gcptr32 = *(uint32_t *)(uVar5 + 0x3c);
    *(int *)(uVar5 + 0x3c) = (int)t;
  }
  return pTVar1;
}

Assistant:

TValue *lj_tab_newkey(lua_State *L, GCtab *t, cTValue *key)
{
  Node *n = hashkey(t, key);
  if (!tvisnil(&n->val) || t->hmask == 0) {
    Node *nodebase = noderef(t->node);
    Node *collide, *freenode = noderef(nodebase->freetop);
    lua_assert(freenode >= nodebase && freenode <= nodebase+t->hmask+1);
    do {
      if (freenode == nodebase) {  /* No free node found? */
	rehashtab(L, t, key);  /* Rehash table. */
	return lj_tab_set(L, t, key);  /* Retry key insertion. */
      }
    } while (!tvisnil(&(--freenode)->key));
    setmref(nodebase->freetop, freenode);
    lua_assert(freenode != &G(L)->nilnode);
    collide = hashkey(t, &n->key);
    if (collide != n) {  /* Colliding node not the main node? */
      while (noderef(collide->next) != n)  /* Find predecessor. */
	collide = nextnode(collide);
      setmref(collide->next, freenode);  /* Relink chain. */
      /* Copy colliding node into free node and free main node. */
      freenode->val = n->val;
      freenode->key = n->key;
      freenode->next = n->next;
      setmref(n->next, NULL);
      setnilV(&n->val);
      /* Rechain pseudo-resurrected string keys with colliding hashes. */
      while (nextnode(freenode)) {
	Node *nn = nextnode(freenode);
	if (tvisstr(&nn->key) && !tvisnil(&nn->val) &&
	    hashstr(t, strV(&nn->key)) == n) {
	  freenode->next = nn->next;
	  nn->next = n->next;
	  setmref(n->next, nn);
	} else {
	  freenode = nn;
	}
      }
    } else {  /* Otherwise use free node. */
      setmrefr(freenode->next, n->next);  /* Insert into chain. */
      setmref(n->next, freenode);
      n = freenode;
    }
  }
  n->key.u64 = key->u64;
  if (LJ_UNLIKELY(tvismzero(&n->key)))
    n->key.u64 = 0;
  lj_gc_anybarriert(L, t);
  lua_assert(tvisnil(&n->val));
  return &n->val;
}